

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O3

from_chars_result_t<char>
fast_float::from_chars_advanced<float,char>
          (char *first,char *last,float *value,parse_options_t<char> options)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  from_chars_result_t<char> fVar16;
  from_chars_result_t<char> fVar17;
  from_chars_result_t<char> fVar18;
  from_chars_result_t<char> fVar19;
  from_chars_result_t<char> fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  uint uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  undefined4 uVar28;
  long lVar29;
  undefined4 uVar30;
  byte *pbVar31;
  ulong uVar32;
  ulong uVar33;
  byte *pbVar34;
  byte *pbVar35;
  uint uVar36;
  long lVar37;
  size_t sVar38;
  ulong uVar39;
  int32_t exponent;
  ulong uVar40;
  byte bVar41;
  bigint *bigmant;
  int iVar42;
  uint uVar43;
  byte *pbVar44;
  float fVar45;
  from_chars_result_t<char> fVar46;
  adjusted_mantissa aVar47;
  parsed_number_string_t<char> answer;
  size_t digits;
  byte *local_280;
  parsed_number_string_t<char> local_278;
  size_t local_230;
  bigint local_228;
  
  if (first == last) {
    fVar46._8_8_ = 0x16;
    fVar46.ptr = first;
    return fVar46;
  }
  local_278.fraction.ptr = (char *)0x0;
  local_278.fraction.length = 0;
  local_278.integer.ptr = (char *)0x0;
  local_278.integer.length = 0;
  local_278.exponent = 0;
  local_278.mantissa._0_3_ = 0;
  local_278.mantissa._3_5_ = 0;
  local_278.lastmatch._0_3_ = 0;
  local_278.lastmatch._3_5_ = 0;
  local_278.valid = false;
  local_278.too_many_digits = false;
  cVar1 = *first;
  local_278.negative = cVar1 == '-';
  uVar43 = (uint)local_278.negative;
  bVar41 = options.decimal_point;
  pbVar31 = (byte *)first;
  if ((local_278.negative) &&
     ((pbVar31 = (byte *)(first + 1), pbVar31 == (byte *)last ||
      (*pbVar31 != bVar41 && 9 < (byte)(*pbVar31 - 0x30))))) goto LAB_003ec9ad;
  uVar33 = ~(ulong)pbVar31;
  local_278.integer.length = 0;
  uVar39 = 0;
  do {
    bVar2 = pbVar31[local_278.integer.length];
    if (9 < (byte)(bVar2 - 0x30)) {
      local_280 = pbVar31 + local_278.integer.length;
      if (bVar2 != bVar41) {
        pbVar44 = (byte *)0x0;
        sVar38 = local_278.integer.length;
        pbVar35 = local_280;
        goto LAB_003ec8f0;
      }
      local_278.fraction.ptr = (char *)(pbVar31 + local_278.integer.length + 1);
      local_278.fraction.length = (size_t)local_278.fraction.ptr;
      pbVar44 = (byte *)local_278.fraction.ptr;
      if ((long)(last + (uVar33 - local_278.integer.length)) < 8) goto LAB_003ec894;
      lVar37 = uVar33 - local_278.integer.length;
      goto LAB_003ec7f1;
    }
    uVar39 = ((ulong)bVar2 + uVar39 * 10) - 0x30;
    lVar37 = local_278.integer.length + 1;
    local_278.integer.length = local_278.integer.length + 1;
  } while (pbVar31 + lVar37 != (byte *)last);
  pbVar44 = (byte *)0x0;
  sVar38 = (long)last - (long)pbVar31;
  pbVar35 = (byte *)last;
  local_280 = (byte *)last;
  local_278.integer.length = (long)last - (long)pbVar31;
  goto LAB_003ec8f0;
LAB_003ecb46:
  pbVar44 = local_280 + (lVar37 - (long)pbVar31);
  local_278.mantissa._0_3_ = (undefined3)uVar39;
  local_278.mantissa._3_5_ = (undefined5)(uVar39 >> 0x18);
  bVar3 = true;
  goto LAB_003ecb59;
  while( true ) {
    uVar32 = (uVar32 >> 8) + uVar32 * 10;
    uVar39 = ((uVar32 >> 0x10 & 0xff000000ff) * 0x271000000001 +
              (uVar32 & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar39 * 100000000;
    pbVar44 = pbVar44 + 8;
    lVar29 = lVar37 + -8;
    lVar37 = lVar37 + -8;
    if ((long)(last + lVar29) < 8) break;
LAB_003ec7f1:
    uVar32 = *(long *)pbVar44 + 0xcfcfcfcfcfcfcfd0;
    if (((*(long *)pbVar44 + 0x4646464646464646U | uVar32) & 0x8080808080808080) != 0) break;
  }
  uVar43 = (uint)CONCAT71(0x80808080808080,local_278.negative);
  local_278.fraction.length = (size_t)-lVar37;
LAB_003ec894:
  pbVar35 = pbVar44;
  if (pbVar44 != (byte *)last) {
    pbVar34 = pbVar44 + ((long)last - local_278.fraction.length);
    do {
      bVar2 = *pbVar44;
      local_278.fraction.length = (size_t)pbVar44;
      pbVar35 = pbVar44;
      if (9 < (byte)(bVar2 - 0x30)) break;
      pbVar44 = pbVar44 + 1;
      uVar39 = (ulong)(byte)(bVar2 - 0x30) + uVar39 * 10;
      local_278.fraction.length = (size_t)pbVar34;
      pbVar35 = pbVar34;
    } while (pbVar44 != (byte *)last);
  }
  pbVar44 = pbVar31 + (local_278.integer.length - local_278.fraction.length) + 1;
  local_278.fraction.length = local_278.fraction.length + (uVar33 - local_278.integer.length);
  sVar38 = local_278.integer.length - (long)pbVar44;
LAB_003ec8f0:
  local_278.integer.ptr = (char *)pbVar31;
  if (sVar38 == 0) goto LAB_003ec9ad;
  if (((ulong)options & 1) == 0) {
LAB_003ec9c3:
    lVar37 = 0;
  }
  else {
    if ((pbVar35 == (byte *)last) || ((*pbVar35 | 0x20) != 0x65)) {
LAB_003ec9a7:
      if (((ulong)options & 4) == 0) {
LAB_003ec9ad:
        fVar46 = detail::parse_infnan<float,char>(first,last,value);
        return fVar46;
      }
      goto LAB_003ec9c3;
    }
    pbVar34 = pbVar35 + 1;
    if (pbVar34 == (byte *)last) {
LAB_003ec94e:
      bVar3 = false;
    }
    else {
      if (*pbVar34 != 0x2d) {
        if (*pbVar34 == 0x2b) {
          pbVar34 = pbVar35 + 2;
        }
        goto LAB_003ec94e;
      }
      pbVar34 = pbVar35 + 2;
      bVar3 = true;
    }
    if ((pbVar34 == (byte *)last) || (9 < (byte)(*pbVar34 - 0x30))) goto LAB_003ec9a7;
    lVar29 = 0;
    do {
      pbVar35 = pbVar34;
      if (9 < (byte)(*pbVar34 - 0x30)) break;
      if (lVar29 < 0x10000000) {
        lVar29 = (ulong)(byte)(*pbVar34 - 0x30) + lVar29 * 10;
      }
      pbVar34 = pbVar34 + 1;
      pbVar35 = (byte *)last;
    } while (pbVar34 != (byte *)last);
    lVar37 = -lVar29;
    if (!bVar3) {
      lVar37 = lVar29;
    }
    pbVar44 = pbVar44 + lVar37;
  }
  local_278.lastmatch._0_3_ = SUB83(pbVar35,0);
  local_278.lastmatch._3_5_ = (undefined5)((ulong)pbVar35 >> 0x18);
  local_278.valid = true;
  pbVar34 = pbVar31;
  if (0x13 < (long)sVar38) {
    do {
      bVar2 = *pbVar34;
      if (bVar2 != bVar41 && bVar2 != 0x30) break;
      sVar38 = sVar38 - (bVar2 == 0x30);
      pbVar34 = pbVar34 + 1;
    } while (pbVar34 != (byte *)last);
    if (0x13 < (long)sVar38) {
      local_278.too_many_digits = true;
      pbVar34 = (byte *)local_278.fraction.ptr;
      pbVar44 = (byte *)local_278.fraction.length;
      if (local_278.integer.length == 0) {
        uVar39 = 0;
        goto joined_r0x003ecb0c;
      }
      uVar39 = 0;
      sVar38 = local_278.integer.length;
      do {
        sVar38 = sVar38 - 1;
        uVar39 = ((long)(char)*pbVar31 + uVar39 * 10) - 0x30;
        pbVar31 = pbVar31 + 1;
        if (999999999999999999 < uVar39) break;
      } while (sVar38 != 0);
      do {
        if (999999999999999999 < uVar39) goto LAB_003ecb46;
joined_r0x003ecb0c:
        pbVar31 = pbVar34;
        local_280 = (byte *)local_278.fraction.ptr;
        if (pbVar44 == (byte *)0x0) goto LAB_003ecb46;
        uVar39 = ((long)(char)*pbVar31 + uVar39 * 10) - 0x30;
        pbVar31 = pbVar31 + 1;
        pbVar34 = pbVar31;
        pbVar44 = pbVar44 + -1;
      } while( true );
    }
  }
  local_278.mantissa._0_3_ = (undefined3)uVar39;
  local_278.mantissa._3_5_ = (undefined5)(uVar39 >> 0x18);
  if ((byte *)0xffffffffffffffea < pbVar44 + -0xb) {
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < (long)pbVar44) &&
         (uVar39 <= (ulong)(&binary_format_lookup_tables<float,void>::max_mantissa)[(long)pbVar44]))
      {
        if (uVar39 == 0) {
          if (cVar1 == '-') {
            fVar45 = -0.0;
          }
          else {
            fVar45 = 0.0;
          }
          *value = fVar45;
          fVar20._8_8_ = 0;
          fVar20.ptr = (char *)pbVar35;
          return fVar20;
        }
        fVar45 = (float)uVar39 *
                 (float)(&binary_format_lookup_tables<float,void>::powers_of_ten)[(long)pbVar44];
        goto LAB_003ecca2;
      }
    }
    else if (uVar39 < 0x1000001) {
      fVar45 = (float)(long)uVar39;
      *value = fVar45;
      if ((long)pbVar44 < 0) {
        fVar45 = fVar45 / (float)(&binary_format_lookup_tables<float,void>::powers_of_ten)
                                 [-(long)pbVar44];
      }
      else {
        fVar45 = fVar45 * (float)(&binary_format_lookup_tables<float,void>::powers_of_ten)
                                 [(long)pbVar44];
      }
LAB_003ecca2:
      fVar19._8_8_ = 0;
      fVar19.ptr = (char *)pbVar35;
      fVar18._8_8_ = 0;
      fVar18.ptr = (char *)pbVar35;
      *value = fVar45;
      if (cVar1 != '-') {
        return fVar18;
      }
      *value = -fVar45;
      return fVar19;
    }
  }
  bVar3 = false;
LAB_003ecb59:
  uVar36 = 0;
  iVar42 = (int)pbVar44;
  if ((long)pbVar44 < -0x41) {
LAB_003ecb7b:
    bigmant = (bigint *)0x0;
  }
  else {
    bigmant = (bigint *)0x0;
    uVar36 = 0;
    if (uVar39 != 0) {
      if (0x26 < (long)pbVar44) {
        uVar36 = 0xff;
        goto LAB_003ecb7b;
      }
      uVar33 = 0x3f;
      if (uVar39 != 0) {
        for (; uVar39 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar32 = uVar39 << ((byte)(uVar33 ^ 0x3f) & 0x3f);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar32;
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ac) * 8);
      auVar4 = auVar4 * auVar10;
      if ((~auVar4._8_8_ & 0x3fffffffff) == 0) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar32;
        auVar11._8_8_ = 0;
        auVar11._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ad) * 8);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = SUB168(auVar5 * auVar11,8);
        auVar4 = auVar4 + auVar21;
      }
      iVar25 = ((iVar42 * 0x3526a >> 0x10) - (int)(uVar33 ^ 0x3f)) - (auVar4._12_4_ >> 0x1f);
      iVar27 = iVar25 + 0xbe;
      bVar41 = auVar4[0xf] >> 7;
      uVar33 = auVar4._8_8_ >> (bVar41 | 0x26);
      if (iVar27 < 1) {
        uVar36 = 1 - iVar27;
        if (uVar36 < 0x40) {
          uVar33 = (uVar33 >> ((byte)uVar36 & 0x3f)) +
                   (ulong)((uVar33 >> ((ulong)uVar36 & 0x3f) & 1) != 0);
          bigmant = (bigint *)(uVar33 >> 1 & 0x7fffffff);
          uVar36 = (uint)(0xffffff < uVar33);
        }
        else {
          bigmant = (bigint *)0x0;
          uVar36 = 0;
        }
      }
      else {
        uVar32 = (ulong)((uint)uVar33 & 0x3fffffe);
        if (uVar33 << (bVar41 | 0x26) != auVar4._8_8_ || ((uint)uVar33 & 3) != 1) {
          uVar32 = uVar33;
        }
        if (1 < auVar4._0_8_) {
          uVar32 = uVar33;
        }
        if ((byte *)0x1b < pbVar44 + 0x11) {
          uVar32 = uVar33;
        }
        uVar32 = ((uint)uVar32 & 1) + uVar32;
        uVar36 = (iVar25 + 0xbf) - (uint)(uVar32 < 0x2000000);
        bigmant = (bigint *)(ulong)((uint)(uVar32 >> 1) & 0x37fffff);
        if (0x1ffffff < uVar32) {
          bigmant = (bigint *)0x0;
        }
        if (0xfe < uVar36) {
          bigmant = (bigint *)0x0;
          uVar36 = 0xff;
        }
      }
    }
  }
  if (!bVar3) goto LAB_003ed02b;
  uVar33 = uVar39 + 1;
  uVar24 = 0;
  if ((long)pbVar44 < -0x41) {
LAB_003ecd38:
    uVar26 = 0;
  }
  else {
    uVar26 = 0;
    uVar24 = 0;
    if (uVar33 != 0) {
      if (0x26 < (long)pbVar44) {
        uVar24 = 0xff;
        goto LAB_003ecd38;
      }
      uVar32 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> uVar32 == 0; uVar32 = uVar32 - 1) {
        }
      }
      uVar33 = uVar33 << ((byte)(uVar32 ^ 0x3f) & 0x3f);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar33;
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ac) * 8);
      auVar6 = auVar6 * auVar12;
      if ((~auVar6._8_8_ & 0x3fffffffff) == 0) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar33;
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ad) * 8);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = SUB168(auVar7 * auVar13,8);
        auVar6 = auVar6 + auVar22;
      }
      iVar25 = ((iVar42 * 0x3526a >> 0x10) - (int)(uVar32 ^ 0x3f)) - (auVar6._12_4_ >> 0x1f);
      iVar27 = iVar25 + 0xbe;
      bVar41 = auVar6[0xf] >> 7;
      uVar33 = auVar6._8_8_ >> (bVar41 | 0x26);
      if (iVar27 < 1) {
        uVar24 = 1 - iVar27;
        if (uVar24 < 0x40) {
          uVar33 = (uVar33 >> ((byte)uVar24 & 0x3f)) +
                   (ulong)((uVar33 >> ((ulong)uVar24 & 0x3f) & 1) != 0);
          uVar26 = (uint)uVar33 >> 1;
          uVar24 = (uint)(0xffffff < uVar33);
        }
        else {
          uVar26 = 0;
          uVar24 = 0;
        }
      }
      else {
        uVar32 = (ulong)((uint)uVar33 & 0x3fffffe);
        if (uVar33 << (bVar41 | 0x26) != auVar6._8_8_ || ((uint)uVar33 & 3) != 1) {
          uVar32 = uVar33;
        }
        if (1 < auVar6._0_8_) {
          uVar32 = uVar33;
        }
        if ((byte *)0x1b < pbVar44 + 0x11) {
          uVar32 = uVar33;
        }
        uVar32 = ((uint)uVar32 & 1) + uVar32;
        uVar24 = (iVar25 + 0xbf) - (uint)(uVar32 < 0x2000000);
        uVar26 = (uint)(uVar32 >> 1) & 0x37fffff;
        if (0x1ffffff < uVar32) {
          uVar26 = 0;
        }
        if (0xfe < uVar24) {
          uVar26 = 0;
          uVar24 = 0xff;
        }
      }
    }
  }
  if (((uint)bigmant != uVar26) || (uVar36 != uVar24)) {
    local_278.exponent = (int64_t)pbVar44;
    if (uVar39 == 0) {
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    uVar33 = 0x3f;
    if (uVar39 != 0) {
      for (; uVar39 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar40 = uVar39 << ((byte)(uVar33 ^ 0x3f) & 0x3f);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar40;
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ac) * 8);
    uVar32 = SUB168(auVar8 * auVar14,8);
    if ((~uVar32 & 0x3fffffffff) == 0) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar40;
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar42 * 2 + 0x2ad) * 8);
      uVar32 = uVar32 + CARRY8(SUB168(auVar9 * auVar15,8),SUB168(auVar8 * auVar14,0));
    }
    bigmant = (bigint *)(uVar32 << ((byte)(uVar32 >> 0x3f) ^ 1));
    iVar27 = iVar42 * 0x3526a >> 0x10;
    iVar25 = -(int)(uVar33 ^ 0x3f) - (int)((long)uVar32 >> 0x3f);
    iVar42 = iVar25 + iVar27;
    if (iVar42 < 0x7f6a) {
      uVar33 = uVar39;
      if (9999 < uVar39) {
        do {
          uVar39 = uVar33 / 10000;
          pbVar44 = (byte *)(ulong)((int)pbVar44 + 4);
          bVar3 = 99999999 < uVar33;
          uVar33 = uVar39;
        } while (bVar3);
      }
      uVar33 = uVar39;
      if (99 < uVar39) {
        do {
          uVar33 = uVar39 / 100;
          pbVar44 = (byte *)(ulong)((int)pbVar44 + 2);
          bVar3 = 9999 < uVar39;
          uVar39 = uVar33;
        } while (bVar3);
      }
      uVar43 = (uint)pbVar44;
      if (9 < uVar33) {
        do {
          uVar43 = (int)pbVar44 + 1;
          pbVar44 = (byte *)(ulong)uVar43;
          bVar3 = 99 < uVar33;
          uVar33 = uVar33 / 10;
        } while (bVar3);
      }
      local_230 = 0;
      memset(&local_228,0,0x1f8);
      exponent = (int32_t)uVar40;
      parse_mantissa<char>(&local_228,&local_278,0x72,&local_230);
      iVar25 = (uVar43 - (int)local_230) + 1;
      if (iVar25 < 0) {
        aVar47.mantissa = (ulong)(iVar42 + 0x96);
        aVar47.power2 = iVar25;
        aVar47._12_4_ = 0;
        aVar47 = negative_digit_comp<float>((fast_float *)&local_228,bigmant,aVar47,exponent);
        auVar23 = aVar47._0_12_;
      }
      else {
        aVar47 = positive_digit_comp<float>(&local_228,iVar25);
        auVar23 = aVar47._0_12_;
      }
      bigmant = auVar23._0_8_;
      uVar36 = auVar23._8_4_;
      uVar43 = (uint)local_278.negative;
      uVar39 = CONCAT53(local_278.mantissa._3_5_,(undefined3)local_278.mantissa);
    }
    else {
      uVar36 = (iVar25 + iVar27) - 0x7f6a;
      uVar39 = 1;
    }
  }
LAB_003ed02b:
  uVar28 = 0;
  if (uVar36 == 0xff) {
    uVar28 = 0x22;
  }
  uVar30 = 0x22;
  if (uVar36 != 0) {
    uVar30 = uVar28;
  }
  if (bigmant != (bigint *)0x0) {
    uVar30 = uVar28;
  }
  fVar16.ec = uVar30;
  fVar16.ptr = (char *)pbVar35;
  fVar16._12_4_ = 0;
  *value = (float)(uVar43 << 0x1f | uVar36 << 0x17 | (uint)bigmant);
  if (uVar39 != 0) {
    return fVar16;
  }
  fVar17.ec = uVar28;
  fVar17.ptr = (char *)pbVar35;
  fVar17._12_4_ = 0;
  return fVar17;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}